

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  uint32 *ts2cb;
  ulong uVar5;
  uint32 n_cb;
  model_def_t *mdef;
  model_def_t *local_20;
  
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
  n_cb = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
          ,0x48,"Reading model definition file %s\n",pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
  iVar1 = model_def_read(&local_20,pcVar4);
  if (iVar1 != 0) goto LAB_001029e1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
          ,0x4e,"%d tied states defined\n",(ulong)local_20->n_tied_state);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-tyingtype");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
          ,0x52,"Generating state parameter definitions for %s tying\n",pcVar4);
  ts2cb = (uint32 *)
          __ckd_calloc__((ulong)local_20->n_tied_state,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                         ,0x54);
  iVar2 = strcmp(pcVar4,"semi");
  if (iVar2 != 0) {
    iVar2 = strcmp(pcVar4,"pd");
    if (iVar2 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
              ,0x5a,"Phone dependent codebooks not yet implemented\n");
      goto LAB_001029e1;
    }
    iVar2 = strcmp(pcVar4,"cont");
    if (iVar2 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
              ,99,"Unknown tying type %s given\n",pcVar4);
      goto LAB_001029e1;
    }
    n_cb = local_20->n_tied_state;
    if (n_cb != 0) {
      uVar5 = 0;
      do {
        ts2cb[uVar5] = (uint32)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_20->n_tied_state);
    }
  }
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
          ,0x66,"Writing %s\n",pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
  iVar2 = s3ts2cb_write(pcVar4,ts2cb,local_20->n_tied_state,n_cb);
  if (iVar2 == 0) {
    return 0;
  }
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_ts2cb/main.c"
                 ,0x6c,"Unable to write %s\n",pcVar4);
LAB_001029e1:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    uint32 *spd;
    model_def_t *mdef;
    const char *tying_type;
    uint32 i;
    uint32 n_cb=0;
    
    parse_cmd_ln(argc, argv);

    E_INFO("Reading model definition file %s\n", cmd_ln_str("-moddeffn"));
    
    if (model_def_read(&mdef, cmd_ln_str("-moddeffn")) != S3_SUCCESS) {
	exit(1);
    }

    E_INFO("%d tied states defined\n", mdef->n_tied_state);

    tying_type = cmd_ln_str("-tyingtype");

    E_INFO("Generating state parameter definitions for %s tying\n", tying_type);
    
    spd = ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    if (strcmp(tying_type, "semi") == 0) {
	n_cb = 1;
    }
    else if (strcmp(tying_type, "pd") == 0) {
	E_INFO("Phone dependent codebooks not yet implemented\n");
	exit(1);
    }
    else if (strcmp(tying_type, "cont") == 0) {
	n_cb = mdef->n_tied_state;
	for (i = 0; i < mdef->n_tied_state; i++)
	    spd[i] = i;
    }
    else {
	E_FATAL("Unknown tying type %s given\n", tying_type);
    }

    E_INFO("Writing %s\n", cmd_ln_str("-ts2cbfn"));

    if (s3ts2cb_write(cmd_ln_str("-ts2cbfn"),
		      spd,
		      mdef->n_tied_state,
		      n_cb) != S3_SUCCESS) {
	E_FATAL_SYSTEM("Unable to write %s\n", cmd_ln_str("-ts2cbfn"));
    }

    return 0;
}